

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.hpp
# Opt level: O0

void __thiscall helics::FederateState::sleeplock(FederateState *this)

{
  char cVar1;
  long in_RDI;
  int ii;
  int local_3c;
  
  LOCK();
  cVar1 = *(char *)(in_RDI + 0x520);
  *(char *)(in_RDI + 0x520) = '\x01';
  UNLOCK();
  if (cVar1 != '\0') {
    for (local_3c = 0; local_3c < 10000; local_3c = local_3c + 1) {
      LOCK();
      cVar1 = *(char *)(in_RDI + 0x520);
      *(char *)(in_RDI + 0x520) = '\x01';
      UNLOCK();
      if (cVar1 == '\0') {
        return;
      }
    }
    while( true ) {
      LOCK();
      cVar1 = *(char *)(in_RDI + 0x520);
      *(char *)(in_RDI + 0x520) = '\x01';
      UNLOCK();
      if (cVar1 == '\0') break;
      std::this_thread::yield();
    }
  }
  return;
}

Assistant:

void sleeplock() const
    {
        if (!processing.test_and_set()) {
            return;
        }
        // spin for 10000 tries
        for (int ii = 0; ii < 10000; ++ii) {
            if (!processing.test_and_set()) {
                return;
            }
        }
        while (processing.test_and_set()) {
            std::this_thread::yield();
        }
    }